

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error IsMacBinary(FT_Library library,FT_Stream stream,FT_Long face_index,FT_Face *aface)

{
  FT_Long offset;
  FT_Long dlen;
  FT_Byte local_b8;
  byte local_b7;
  FT_Byte aFStack_b6 [2];
  FT_Error error;
  uchar header [128];
  FT_Face *aface_local;
  FT_Long face_index_local;
  FT_Stream stream_local;
  FT_Library library_local;
  
  if (stream == (FT_Stream)0x0) {
    library_local._4_4_ = 0x55;
  }
  else {
    dlen._4_4_ = FT_Stream_Seek(stream,0);
    if ((dlen._4_4_ == 0) && (dlen._4_4_ = FT_Stream_Read(stream,&local_b8,0x80), dlen._4_4_ == 0))
    {
      if ((((local_b8 == '\0') &&
           (((header[0x42] == '\0' && (header[0x4a] == '\0')) && (local_b7 != 0)))) &&
          (((local_b7 < 0x22 && (header[0x37] == '\0')) &&
           ((&local_b8)[(int)(local_b7 + 2)] == '\0')))) && (header[0x4b] < 0x80)) {
        library_local._4_4_ =
             IsMacResource(library,stream,
                           ((long)(int)((uint)header[0x4b] << 0x18 | (uint)header[0x4c] << 0x10 |
                                        (uint)header[0x4d] << 8 | (uint)header[0x4e]) + 0x7fU &
                           0xffffffffffffff80) + 0x80,face_index,aface);
      }
      else {
        library_local._4_4_ = 2;
      }
    }
    else {
      library_local._4_4_ = dlen._4_4_;
    }
  }
  return library_local._4_4_;
}

Assistant:

static FT_Error
  IsMacBinary( FT_Library  library,
               FT_Stream   stream,
               FT_Long     face_index,
               FT_Face    *aface )
  {
    unsigned char  header[128];
    FT_Error       error;
    FT_Long        dlen, offset;


    if ( !stream )
      return FT_THROW( Invalid_Stream_Operation );

    error = FT_Stream_Seek( stream, 0 );
    if ( error )
      goto Exit;

    error = FT_Stream_Read( stream, (FT_Byte*)header, 128 );
    if ( error )
      goto Exit;

    if (            header[ 0] !=   0 ||
                    header[74] !=   0 ||
                    header[82] !=   0 ||
                    header[ 1] ==   0 ||
                    header[ 1] >   33 ||
                    header[63] !=   0 ||
         header[2 + header[1]] !=   0 ||
                  header[0x53] > 0x7F )
      return FT_THROW( Unknown_File_Format );

    dlen = ( header[0x53] << 24 ) |
           ( header[0x54] << 16 ) |
           ( header[0x55] <<  8 ) |
             header[0x56];
#if 0
    rlen = ( header[0x57] << 24 ) |
           ( header[0x58] << 16 ) |
           ( header[0x59] <<  8 ) |
             header[0x5A];
#endif /* 0 */
    offset = 128 + ( ( dlen + 127 ) & ~127 );

    return IsMacResource( library, stream, offset, face_index, aface );

  Exit:
    return error;
  }